

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::printSummaryRow
          (ConsoleReporter *this,string *label,
          vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
          *cols,size_t row)

{
  Code CVar1;
  pointer pbVar2;
  pointer pcVar3;
  int iVar4;
  IColourImpl *pIVar5;
  ostream *poVar6;
  pointer pSVar7;
  string value;
  Colour local_61;
  char *local_60;
  long local_58;
  char local_50 [16];
  string *local_40;
  vector<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
  *local_38;
  
  pSVar7 = (cols->
           super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = label;
  local_38 = cols;
  if (pSVar7 != (cols->
                super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pbVar2 = (pSVar7->rows).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = pbVar2[row]._M_dataplus._M_p;
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar3,pcVar3 + pbVar2[row]._M_string_length);
      if ((pSVar7->label)._M_string_length == 0) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((this->super_StreamingReporterBase).stream,(local_40->_M_dataplus)._M_p,
                            local_40->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        iVar4 = std::__cxx11::string::compare((char *)&local_60);
        poVar6 = (this->super_StreamingReporterBase).stream;
        if (iVar4 == 0) {
          local_61.m_moved = false;
          pIVar5 = Colour::impl();
          (**(code **)(*(long *)pIVar5 + 0x10))(pIVar5,6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"- none -",8);
          goto LAB_001494fe;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_60,local_58);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_60);
        if (iVar4 != 0) {
          poVar6 = (this->super_StreamingReporterBase).stream;
          local_61.m_moved = false;
          pIVar5 = Colour::impl();
          (**(code **)(*(long *)pIVar5 + 0x10))(pIVar5,0x17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," | ",3);
          Colour::~Colour(&local_61);
          poVar6 = (this->super_StreamingReporterBase).stream;
          CVar1 = pSVar7->colour;
          local_61.m_moved = false;
          pIVar5 = Colour::impl();
          (**(code **)(*(long *)pIVar5 + 0x10))(pIVar5,CVar1);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_60,local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,(pSVar7->label)._M_dataplus._M_p,(pSVar7->label)._M_string_length);
LAB_001494fe:
          Colour::~Colour(&local_61);
        }
      }
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != (local_38->
                       super__Vector_base<Catch::ConsoleReporter::SummaryColumn,_std::allocator<Catch::ConsoleReporter::SummaryColumn>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).stream,"\n",1);
  return;
}

Assistant:

void printSummaryRow( std::string const& label, std::vector<SummaryColumn> const& cols, std::size_t row ) {
            for( std::vector<SummaryColumn>::const_iterator it = cols.begin(); it != cols.end(); ++it ) {
                std::string value = it->rows[row];
                if( it->label.empty() ) {
                    stream << label << ": ";
                    if( value != "0" )
                        stream << value;
                    else
                        stream << Colour( Colour::Warning ) << "- none -";
                }
                else if( value != "0" ) {
                    stream  << Colour( Colour::LightGrey ) << " | ";
                    stream  << Colour( it->colour )
                            << value << " " << it->label;
                }
            }
            stream << "\n";
        }